

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_InvertUniformSphere_Test::TestBody(Sampling_InvertUniformSphere_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Point2<float> *pPVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  AssertionResult gtest_ar;
  Uniform2DIter __begin1;
  float in_stack_ffffffffffffff4c;
  AssertHelper local_98;
  long local_90;
  undefined1 local_88 [16];
  internal local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Uniform2DIter local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.n = 1000;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.inc = 1;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state =
       (uint64_t)&DAT_5851f42d4c957f2e;
  do {
    auVar12._0_8_ = pbrt::detail::Uniform2DIter::operator*(&local_48);
    auVar12._8_56_ = extraout_var_00;
    local_58 = auVar12._0_16_;
    auVar2 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),local_58,ZEXT416(0xc0000000));
    auVar9 = vfnmadd213ss_fma(auVar2,auVar2,SUB6416(ZEXT464(0x3f800000),0));
    auVar9 = vmaxss_avx(auVar9,ZEXT816(0));
    local_68 = vmovshdup_avx(local_58);
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar11 = local_68._0_4_ * 6.2831855;
    fVar10 = cosf(fVar11);
    fVar11 = sinf(fVar11);
    auVar13._0_4_ = atan2f(fVar11 * auVar9._0_4_,fVar10 * auVar9._0_4_);
    auVar13._4_60_ = extraout_var;
    uVar1 = vcmpss_avx512f(auVar13._0_16_,ZEXT416(0),1);
    bVar5 = (bool)((byte)uVar1 & 1);
    local_98.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(ZEXT416((uint)((float)local_58._0_4_ - (1.0 - auVar2._0_4_) * 0.5)),
                             auVar9);
    fVar11 = auVar9._0_4_;
    testing::internal::CmpHelperLT<float,double>
              (local_78,"std::abs(u.x - up.x)","1e-3",(float *)&stack0xffffffffffffff48,
               (double *)&local_98);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff48);
      pPVar7 = (Point2<float> *)0x6105c6;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),"u ",2);
      pbrt::operator<<((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),pPVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10)," -> ",4);
      lVar3 = CONCAT44(in_stack_ffffffffffffff4c,fVar11);
      pbrt::internal::ToString3<float>(in_stack_ffffffffffffff4c,fVar11,0.0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(lVar3 + 0x10),(char *)local_98.data_,local_90);
      if (local_98.data_ != (AssertHelperData *)local_88) {
        operator_delete(local_98.data_,local_88._0_8_ + 1);
      }
      pcVar8 = " -> ";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10)," -> ",4);
      pbrt::operator<<((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),
                       (Point2<float> *)pcVar8);
      pcVar8 = "";
      if (local_70._M_p != (pointer)0x0) {
        pcVar8 = *(char **)local_70._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (CONCAT44(in_stack_ffffffffffffff4c,fVar11) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)CONCAT44(in_stack_ffffffffffffff4c,fVar11) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(ZEXT416((uint)((float)local_68._0_4_ -
                                           (float)((uint)bVar5 * (int)(auVar13._0_4_ + 6.2831855) +
                                                  (uint)!bVar5 * (int)auVar13._0_4_) / 6.2831855)),
                             auVar2);
    fVar11 = auVar9._0_4_;
    testing::internal::CmpHelperLT<float,double>
              (local_78,"std::abs(u.y - up.y)","1e-3",(float *)&stack0xffffffffffffff48,
               (double *)&local_98);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff48);
      pPVar7 = (Point2<float> *)0x6105c6;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),"u ",2);
      pbrt::operator<<((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),pPVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10)," -> ",4);
      lVar3 = CONCAT44(in_stack_ffffffffffffff4c,fVar11);
      pbrt::internal::ToString3<float>(in_stack_ffffffffffffff4c,fVar11,0.0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(lVar3 + 0x10),(char *)local_98.data_,local_90);
      if (local_98.data_ != (AssertHelperData *)local_88) {
        operator_delete(local_98.data_,local_88._0_8_ + 1);
      }
      pcVar8 = " -> ";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10)," -> ",4);
      pbrt::operator<<((ostream *)(CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 0x10),
                       (Point2<float> *)pcVar8);
      pcVar8 = "";
      if (local_70._M_p != (pointer)0x0) {
        pcVar8 = *(char **)local_70._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5e,pcVar8);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (CONCAT44(in_stack_ffffffffffffff4c,fVar11) != 0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) && ((long *)CONCAT44(in_stack_ffffffffffffff4c,fVar11) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff4c,fVar11) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar6 = local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
            super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1;
    local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
    super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = iVar6;
  } while (iVar6 != 1000);
  return;
}

Assistant:

TEST(Sampling, InvertUniformSphere) {
    for (Point2f u : Uniform2D(1000)) {
        Vector3f v = SampleUniformSphere(u);
        Point2f up = InvertUniformSphereSample(v);

        EXPECT_LT(std::abs(u.x - up.x), 1e-3) << "u " << u << " -> " << v << " -> " << up;
        EXPECT_LT(std::abs(u.y - up.y), 1e-3) << "u " << u << " -> " << v << " -> " << up;
    }
}